

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instance.cpp
# Opt level: O0

Ptr<Instance>
myvk::Instance::CreateWithGlfwExtensions
          (bool use_validation_layer,PFN_vkDebugUtilsMessengerCallbackEXT debug_callback)

{
  PFN_vkCreateInstance p_Var1;
  PFN_vkCreateDebugUtilsMessengerEXT p_Var2;
  VkResult VVar3;
  allocator_type *__a;
  size_type sVar4;
  element_type *peVar5;
  PFN_vkDebugUtilsMessengerCallbackEXT in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  byte in_SIL;
  element_type *in_RDI;
  Ptr<Instance> PVar6;
  VkDebugUtilsMessengerCreateInfoEXT debug_info;
  VkValidationFeaturesEXT validation_features;
  VkValidationFeatureEnableEXT validation_features_enabled [2];
  vector<const_char_*,_std::allocator<const_char_*>_> extensions;
  char **glfw_extensions;
  uint32_t glfw_extension_count;
  VkInstanceCreateInfo create_info;
  VkApplicationInfo app_info;
  shared_ptr<myvk::Instance> ret;
  shared_ptr<myvk::Instance> *in_stack_fffffffffffffe48;
  VkInstance in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe60;
  VkResult in_stack_fffffffffffffe64;
  allocator_type *__last;
  allocator<const_char_*> *__first;
  element_type *this;
  VkDebugUtilsMessengerCreateInfoEXT local_158;
  undefined4 local_11c;
  undefined4 local_118 [2];
  undefined4 *local_110;
  undefined4 local_108;
  undefined8 *local_100;
  undefined8 local_e8;
  char *local_e0;
  allocator<const_char_*> local_d1;
  vector<const_char_*,_std::allocator<const_char_*>_> local_d0;
  allocator_type *local_a8;
  uint local_9c;
  VkInstanceCreateInfo local_98;
  VkApplicationInfo local_58;
  shared_ptr<myvk::Instance> local_28;
  PFN_vkDebugUtilsMessengerCallbackEXT local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  this = in_RDI;
  local_18 = in_RDX;
  std::make_shared<myvk::Instance>();
  local_58.pEngineName = (char *)0x0;
  local_58.pApplicationName = (char *)0x0;
  local_58.applicationVersion = 0;
  local_58._28_4_ = 0;
  local_58.pNext = (void *)0x0;
  local_58.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_58._4_4_ = 0;
  local_58.engineVersion = 0;
  local_58.apiVersion = 0x403000;
  local_98.enabledExtensionCount = 0;
  local_98._52_4_ = 0;
  local_98.ppEnabledExtensionNames = (char **)0x0;
  local_98.enabledLayerCount = 0;
  local_98._36_4_ = 0;
  local_98.ppEnabledLayerNames = (char **)0x0;
  local_98.flags = 0;
  local_98._20_4_ = 0;
  local_98.pNext = (undefined4 *)0x0;
  local_98.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  local_98._4_4_ = 0;
  local_98.pApplicationInfo = &local_58;
  local_9c = 0;
  __a = (allocator_type *)glfwGetRequiredInstanceExtensions((uint32_t *)in_stack_fffffffffffffe48);
  __last = __a + (ulong)local_9c * 8;
  __first = &local_d1;
  local_a8 = __a;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x29f064);
  std::vector<char_const*,std::allocator<char_const*>>::vector<char_const**,void>
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)this,(char **)__first,
             (char **)__last,__a);
  std::allocator<const_char_*>::~allocator(&local_d1);
  if ((local_9 & 1) != 0) {
    local_e0 = "VK_EXT_debug_utils";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffe50,
               (value_type *)in_stack_fffffffffffffe48);
  }
  sVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_d0);
  local_98.enabledExtensionCount = (uint32_t)sVar4;
  local_98.ppEnabledExtensionNames =
       std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                 ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x29f14b);
  local_e8 = 0x400000002;
  memset(local_118,0,0x30);
  local_118[0] = 0x3b9e8ed8;
  local_108 = 2;
  local_100 = &local_e8;
  if ((local_9 & 1) == 0) {
    local_98._32_8_ = (ulong)(uint)local_98._36_4_ << 0x20;
  }
  else {
    local_98.enabledLayerCount = 1;
    local_98.ppEnabledLayerNames = &kValidationLayers;
    local_110 = (undefined4 *)local_98.pNext;
    local_98.pNext = local_118;
  }
  if ((vkCreateInstance == (PFN_vkCreateInstance)0x0) &&
     (VVar3 = volkInitialize(), VVar3 != VK_SUCCESS)) {
    std::shared_ptr<myvk::Instance>::shared_ptr
              ((shared_ptr<myvk::Instance> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  else {
    p_Var1 = vkCreateInstance;
    peVar5 = std::__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x29f24a);
    VVar3 = (*p_Var1)(&local_98,(VkAllocationCallbacks *)0x0,&peVar5->m_instance);
    if (VVar3 == VK_SUCCESS) {
      std::__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x29f29e);
      volkLoadInstanceOnly((VkInstance)0x29f2a7);
      p_Var2 = vkCreateDebugUtilsMessengerEXT;
      if (((local_9 & 1) != 0) && (local_18 != (PFN_vkDebugUtilsMessengerCallbackEXT)0x0)) {
        local_158.pNext = (void *)0x0;
        local_158.sType = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
        local_158._4_4_ = 0;
        local_158.flags = 0;
        local_158.messageSeverity = 0x1111;
        local_158.messageType = 7;
        local_158._28_4_ = 0;
        local_158.pfnUserCallback = local_18;
        local_158.pUserData = (void *)0x0;
        in_stack_fffffffffffffe48 = &local_28;
        peVar5 = std::__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x29f32f);
        in_stack_fffffffffffffe50 = peVar5->m_instance;
        peVar5 = std::__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x29f341);
        in_stack_fffffffffffffe64 =
             (*p_Var2)(in_stack_fffffffffffffe50,&local_158,(VkAllocationCallbacks *)0x0,
                       &peVar5->m_debug_messenger);
        if (in_stack_fffffffffffffe64 != VK_SUCCESS) {
          std::shared_ptr<myvk::Instance>::shared_ptr
                    ((shared_ptr<myvk::Instance> *)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48);
          goto LAB_0029f3a4;
        }
      }
      std::shared_ptr<myvk::Instance>::shared_ptr
                ((shared_ptr<myvk::Instance> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    }
    else {
      std::shared_ptr<myvk::Instance>::shared_ptr
                ((shared_ptr<myvk::Instance> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    }
  }
LAB_0029f3a4:
  local_11c = 1;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  std::shared_ptr<myvk::Instance>::~shared_ptr((shared_ptr<myvk::Instance> *)0x29f3be);
  PVar6.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar6.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<Instance>)PVar6.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Instance> Instance::CreateWithGlfwExtensions(bool use_validation_layer,
                                                 PFN_vkDebugUtilsMessengerCallbackEXT debug_callback) {
	auto ret = std::make_shared<Instance>();

	VkApplicationInfo app_info = {};
	app_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
	app_info.apiVersion = VK_API_VERSION_1_3;

	VkInstanceCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
	create_info.pApplicationInfo = &app_info;

	uint32_t glfw_extension_count = 0;
	const char **glfw_extensions = glfwGetRequiredInstanceExtensions(&glfw_extension_count);
	std::vector<const char *> extensions(glfw_extensions, glfw_extensions + glfw_extension_count);
	if (use_validation_layer)
		extensions.push_back(VK_EXT_DEBUG_UTILS_EXTENSION_NAME);

	create_info.enabledExtensionCount = extensions.size();
	create_info.ppEnabledExtensionNames = extensions.data();

	VkValidationFeatureEnableEXT validation_features_enabled[] = {
	    VK_VALIDATION_FEATURE_ENABLE_BEST_PRACTICES_EXT, VK_VALIDATION_FEATURE_ENABLE_SYNCHRONIZATION_VALIDATION_EXT};
	VkValidationFeaturesEXT validation_features = {};
	validation_features.sType = VK_STRUCTURE_TYPE_VALIDATION_FEATURES_EXT;
	validation_features.enabledValidationFeatureCount =
	    sizeof(validation_features_enabled) / sizeof(VkValidationFeatureEnableEXT);
	validation_features.pEnabledValidationFeatures = validation_features_enabled;

	if (use_validation_layer) {
		create_info.enabledLayerCount = sizeof(kValidationLayers) / sizeof(const char *);
		create_info.ppEnabledLayerNames = kValidationLayers;

		validation_features.pNext = create_info.pNext;
		create_info.pNext = &validation_features;
	} else
		create_info.enabledLayerCount = 0;

	if (vkCreateInstance == nullptr) {
		if (volkInitialize() != VK_SUCCESS)
			return nullptr;
	}

	if (vkCreateInstance(&create_info, nullptr, &ret->m_instance) != VK_SUCCESS)
		return nullptr;
	volkLoadInstanceOnly(ret->m_instance);

	if (use_validation_layer && debug_callback) {
		VkDebugUtilsMessengerCreateInfoEXT debug_info = {};
		debug_info.sType = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
		debug_info.messageSeverity =
		    VK_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT | VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT |
		    VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT | VK_DEBUG_UTILS_MESSAGE_SEVERITY_INFO_BIT_EXT;
		debug_info.messageType = VK_DEBUG_UTILS_MESSAGE_TYPE_GENERAL_BIT_EXT |
		                         VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT |
		                         VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT;
		debug_info.pfnUserCallback = debug_callback;
		debug_info.pUserData = nullptr;

		if (vkCreateDebugUtilsMessengerEXT(ret->m_instance, &debug_info, nullptr, &ret->m_debug_messenger) !=
		    VK_SUCCESS)
			return nullptr;
	}

	return ret;
}